

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
* __thiscall
QPDFNumberTreeObjectHelper::getAsMap
          (map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
           *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this)

{
  iterator local_90;
  iterator local_50;
  undefined1 local_19;
  QPDFNumberTreeObjectHelper *local_18;
  QPDFNumberTreeObjectHelper *this_local;
  map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
  *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (QPDFNumberTreeObjectHelper *)__return_storage_ptr__;
  std::
  map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
  ::map(__return_storage_ptr__);
  begin(&local_50,this);
  end(&local_90,this);
  std::
  map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
  ::insert<QPDFNumberTreeObjectHelper::iterator>(__return_storage_ptr__,&local_50,&local_90);
  iterator::~iterator(&local_90);
  iterator::~iterator(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::map<QPDFNumberTreeObjectHelper::numtree_number, QPDFObjectHandle>
QPDFNumberTreeObjectHelper::getAsMap() const
{
    std::map<numtree_number, QPDFObjectHandle> result;
    result.insert(begin(), end());
    return result;
}